

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O3

int mbedtls_ssl_add_hs_hdr_to_checksum(mbedtls_ssl_context *ssl,uint hs_type,size_t total_hs_len)

{
  int iVar1;
  uchar local_c;
  undefined1 local_b;
  undefined1 local_a;
  undefined1 local_9;
  uchar hs_hdr [4];
  
  local_c = (uchar)hs_type;
  local_b = (undefined1)(total_hs_len >> 0x10);
  local_a = (undefined1)(total_hs_len >> 8);
  local_9 = (undefined1)total_hs_len;
  iVar1 = (*ssl->handshake->update_checksum)(ssl,&local_c,4);
  return iVar1;
}

Assistant:

int mbedtls_ssl_add_hs_hdr_to_checksum(mbedtls_ssl_context *ssl,
                                       unsigned hs_type,
                                       size_t total_hs_len)
{
    unsigned char hs_hdr[4];

    /* Build HS header for checksum update. */
    hs_hdr[0] = MBEDTLS_BYTE_0(hs_type);
    hs_hdr[1] = MBEDTLS_BYTE_2(total_hs_len);
    hs_hdr[2] = MBEDTLS_BYTE_1(total_hs_len);
    hs_hdr[3] = MBEDTLS_BYTE_0(total_hs_len);

    return ssl->handshake->update_checksum(ssl, hs_hdr, sizeof(hs_hdr));
}